

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O1

int fits_read_fits_region(fitsfile *fptr,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  anon_union_120_2_131c4ffb_for_param *array;
  shapeType sVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  SAORegion *pSVar5;
  RgnShape *pRVar6;
  int *piVar7;
  anon_union_120_2_131c4ffb_for_param *array_00;
  long lVar8;
  double *pdVar9;
  uint uVar10;
  undefined4 uVar11;
  char (*pacVar12) [71];
  char *__s2;
  anon_union_120_2_131c4ffb_for_param *paVar13;
  WCSdata *pWVar14;
  WCSdata *pWVar15;
  char *pcVar16;
  ulong uVar17;
  long *naxes;
  double *pdVar18;
  byte bVar19;
  double dVar20;
  double dVar21;
  int anynul;
  anon_union_120_2_131c4ffb_for_param *local_348;
  RgnShape *local_340;
  undefined4 local_334;
  double *local_330;
  WCSdata *local_328;
  anon_union_120_2_131c4ffb_for_param *local_320;
  int *local_318;
  double *local_310;
  SAORegion *local_308;
  double local_300;
  double local_2f8;
  char *local_2f0;
  double *local_2e8;
  double *local_2e0;
  int icol [6];
  char *cvalue;
  double Ypos;
  double Xpos;
  int local_2a8;
  int tstatus;
  double Y;
  double X;
  double *local_290;
  RgnShape *local_288;
  long local_280;
  SAORegion **local_278;
  int idum;
  long icsize [6];
  char comment [73];
  char colname [6] [71];
  
  bVar19 = 0;
  pacVar12 = colname;
  memcpy(pacVar12,&DAT_001de1b0,0x1aa);
  if (*status != 0) {
    return *status;
  }
  local_278 = Rgn;
  pSVar5 = (SAORegion *)malloc(0x58);
  if (pSVar5 == (SAORegion *)0x0) {
    ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
    *status = 0x71;
    return 0x71;
  }
  pSVar5->nShapes = 0;
  pSVar5->Shapes = (RgnShape *)0x0;
  if ((wcs == (WCSdata *)0x0) || (wcs->exists == 0)) {
    (pSVar5->wcs).exists = 0;
  }
  else {
    pWVar14 = wcs;
    pWVar15 = &pSVar5->wcs;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      uVar11 = *(undefined4 *)&pWVar14->field_0x4;
      pWVar15->exists = pWVar14->exists;
      *(undefined4 *)&pWVar15->field_0x4 = uVar11;
      pWVar14 = (WCSdata *)((long)pWVar14 + (ulong)bVar19 * -0x10 + 8);
      pWVar15 = (WCSdata *)((long)pWVar15 + (ulong)bVar19 * -0x10 + 8);
    }
  }
  tstatus = 0;
  lVar8 = 0;
  local_328 = wcs;
  do {
    ffgcno(fptr,0,*pacVar12,(int *)((long)icol + lVar8),&tstatus);
    lVar8 = lVar8 + 4;
    pacVar12 = pacVar12 + 1;
  } while (lVar8 != 0x14);
  if ((tstatus == 0) || (iVar4 = ffmnhd(fptr,2,"REGION",1,status), iVar4 == 0)) {
    iVar4 = ffgky(fptr,0x1f,"NAXIS2",pSVar5,comment,status);
    if (iVar4 == 0) {
      pRVar6 = (RgnShape *)malloc((long)pSVar5->nShapes * 0xa8);
      pSVar5->Shapes = pRVar6;
      if (pRVar6 == (RgnShape *)0x0) {
        pcVar16 = "Failed to allocate memory for Region data";
LAB_001b8619:
        ffpmsg(pcVar16);
        *status = 0x71;
      }
      else {
        pacVar12 = colname;
        lVar8 = 0;
        do {
          iVar4 = ffgcno(fptr,0,*pacVar12,(int *)((long)icol + lVar8),status);
          if (iVar4 != 0) {
            pcVar16 = "Could not find column.";
            goto LAB_001b8375;
          }
          lVar8 = lVar8 + 4;
          pacVar12 = pacVar12 + 1;
        } while (lVar8 != 0x14);
        local_2a8 = ffgcno(fptr,0,colname[5],icol + 5,status);
        local_334 = (undefined4)CONCAT71((uint7)(uint3)((uint)local_2a8 >> 8),1);
        if ((pSVar5->wcs).exists == 0) {
          local_318 = (int *)0x0;
        }
        else {
          piVar7 = (int *)malloc(0x48);
          if (piVar7 == (int *)0x0) {
            pcVar16 = "Failed to allocate memory for Region WCS data";
            goto LAB_001b8619;
          }
          *piVar7 = 1;
          local_340 = (RgnShape *)(piVar7 + 2);
          local_330 = (double *)(piVar7 + 4);
          local_348 = (anon_union_120_2_131c4ffb_for_param *)(piVar7 + 6);
          local_2e0 = (double *)(piVar7 + 10);
          local_310 = (double *)(piVar7 + 0xc);
          local_2e8 = (double *)(piVar7 + 0xe);
          local_2f0 = (char *)(piVar7 + 0x10);
          iVar4 = ffgtcs(fptr,icol[0],icol[1],(double *)local_340,local_330,(double *)local_348,
                         (double *)(piVar7 + 8),local_2e0,local_310,local_2e8,local_2f0,status);
          if (iVar4 != 0) {
            *piVar7 = 0;
            *status = 0;
          }
          local_318 = piVar7;
          if (((*piVar7 != 0) && (local_328->exists != 0)) &&
             ((((1e-06 < ABS(*(double *)local_340 - local_328->xrefval) ||
                ((((1e-06 < ABS(*local_330 - local_328->yrefval) ||
                   (1e-06 < ABS((local_348->gen).p[0] - local_328->xrefpix))) ||
                  (1e-06 < ABS(*(double *)(piVar7 + 8) - local_328->yrefpix))) ||
                 ((1e-06 < ABS(*local_2e0 - local_328->xinc) ||
                  (1e-06 < ABS(*local_310 - local_328->yinc))))))) ||
               (1e-06 < ABS(*local_2e8 - local_328->rot))) ||
              (iVar4 = strcmp(local_2f0,local_328->type), iVar4 == 0)))) {
            local_334 = 0;
          }
        }
        naxes = icsize;
        lVar8 = 0;
        do {
          iVar4 = ffgtdm(fptr,icol[lVar8],1,&idum,naxes,status);
          if (iVar4 != 0) {
            pcVar16 = "Could not find vector size of column.";
            goto LAB_001b8375;
          }
          lVar8 = lVar8 + 1;
          naxes = naxes + 1;
        } while (lVar8 != 6);
        cvalue = (char *)malloc(0x48);
        if (0 < pSVar5->nShapes) {
          local_2e8 = (double *)(local_318 + 0x10);
          local_2f0 = local_328->type;
          pdVar18 = (double *)0x1;
          local_300 = 0.0;
          local_2f8 = 0.0;
          local_308 = pSVar5;
          do {
            pRVar6 = pSVar5->Shapes;
            pdVar9 = pRVar6[(long)pdVar18 + -1].param.gen.p + 6;
            *pdVar9 = 0.0;
            pdVar9[1] = 0.0;
            pdVar9 = pRVar6[(long)pdVar18 + -1].param.gen.p + 4;
            *pdVar9 = 0.0;
            pdVar9[1] = 0.0;
            pdVar9 = pRVar6[(long)pdVar18 + -1].param.gen.p + 2;
            *pdVar9 = 0.0;
            pdVar9[1] = 0.0;
            pRVar6[(long)pdVar18 + -1].param.gen.p[0] = 0.0;
            *(undefined8 *)((long)&pRVar6[(long)pdVar18 + -1].param + 8) = 0;
            pdVar9 = &pRVar6[(long)pdVar18 + -1].param.gen.sinT;
            *pdVar9 = 0.0;
            pdVar9[1] = 0.0;
            pdVar9 = &pRVar6[(long)pdVar18 + -1].param.gen.a;
            *pdVar9 = 0.0;
            pdVar9[1] = 0.0;
            iVar4 = ffgcvs(fptr,icol[2],(LONGLONG)pdVar18,1,1," ",&cvalue,&anynul,status);
            if (iVar4 != 0) {
              pcVar16 = "Could not read shape.";
              goto LAB_001b8375;
            }
            local_288 = pRVar6 + (long)pdVar18 + -1;
            local_288->sign = '\x01';
            pcVar16 = cvalue;
            if (*cvalue == '!') {
              local_288->sign = '\0';
              pcVar16 = cvalue + 1;
            }
            local_340 = pRVar6 + (long)pdVar18;
            local_320 = &pRVar6[(long)pdVar18 + -1].param;
            __s2 = "POINT";
            lVar8 = 0;
            local_330 = pdVar18;
            do {
              iVar4 = strcmp(pcVar16,__s2);
              pRVar6 = local_340;
              if (iVar4 == 0) {
                local_340[-1].shape = *(shapeType *)((long)&DAT_001de820 + lVar8);
              }
              lVar8 = lVar8 + 4;
              __s2 = __s2 + 0x47;
            } while (lVar8 != 0x44);
            array_00 = local_320;
            if (local_340[-1].shape == poly_rgn) {
              array_00 = (anon_union_120_2_131c4ffb_for_param *)
                         calloc(CONCAT44(icsize[0]._4_4_,(int)icsize[0]) * 2,8);
              pRVar6[-1].param.poly.Pts = (double *)array_00;
              if (array_00 == (anon_union_120_2_131c4ffb_for_param *)0x0) {
                pcVar16 = "Could not allocate memory to hold polygon parameters";
                goto LAB_001b8619;
              }
              (local_320->poly).nPts = (int)icsize[0] * 2;
            }
            uVar10 = 1;
            if (pRVar6[-1].shape == poly_rgn) {
              uVar10 = (local_320->poly).nPts / 2;
            }
            if (pRVar6[-1].shape == rectangle_rgn) {
              uVar10 = 2;
            }
            pdVar18 = (double *)(ulong)uVar10;
            if (0 < (int)uVar10) {
              local_280 = (long)pdVar18 << 4;
              lVar8 = 0;
              pdVar9 = (double *)0x0;
              paVar13 = array_00;
              local_348 = array_00;
              local_290 = pdVar18;
              do {
                array = (anon_union_120_2_131c4ffb_for_param *)((long)local_348 + lVar8);
                local_2e0 = (double *)((long)pdVar9 + 1);
                local_310 = pdVar9;
                iVar4 = ffgcvd(fptr,icol[0],(LONGLONG)local_330,(LONGLONG)local_2e0,1,
                               -9.1191291391491e-36,(double *)array,&anynul,status);
                if (iVar4 != 0) {
                  pcVar16 = "Failed to read X column for polygon region";
                  goto LAB_001b8375;
                }
                if (((array->gen).p[0] == -9.1191291391491e-36) &&
                   (pdVar18 = local_310, array_00 = array, !NAN((array->gen).p[0]))) {
LAB_001b89e6:
                  (local_320->poly).nPts = (int)pdVar18 * 2;
                  pRVar6 = local_340;
                  goto LAB_001b89f8;
                }
                pdVar18 = (double *)((long)local_348 + lVar8 + 8);
                iVar4 = ffgcvd(fptr,icol[1],(LONGLONG)local_330,(LONGLONG)local_2e0,1,
                               -9.1191291391491e-36,pdVar18,&anynul,status);
                if (iVar4 != 0) {
                  ffpmsg("Failed to read Y column for polygon region");
                  pSVar5 = local_308;
                  goto LAB_001b837a;
                }
                dVar20 = *pdVar18;
                pSVar5 = local_308;
                if ((dVar20 == -9.1191291391491e-36) &&
                   (pdVar18 = local_310, array_00 = paVar13, !NAN(dVar20))) goto LAB_001b89e6;
                array_00 = (anon_union_120_2_131c4ffb_for_param *)((long)paVar13 + 0x10);
                dVar21 = (array->gen).p[0];
                dVar2 = dVar20;
                dVar3 = dVar21;
                if (lVar8 != 0) {
                  dVar2 = local_300;
                  dVar3 = local_2f8;
                  if ((local_2f8 == dVar21) && (!NAN(local_2f8) && !NAN(dVar21))) {
                    if ((local_300 == dVar20) &&
                       (pdVar18 = local_2e0, !NAN(local_300) && !NAN(dVar20))) goto LAB_001b89e6;
                  }
                }
                local_2f8 = dVar3;
                local_300 = dVar2;
                lVar8 = lVar8 + 0x10;
                pdVar9 = (double *)((long)local_310 + 1);
                paVar13 = array_00;
              } while (local_280 != lVar8);
              array_00 = (anon_union_120_2_131c4ffb_for_param *)((long)local_348 + lVar8);
              pdVar18 = local_290;
              pRVar6 = local_340;
            }
LAB_001b89f8:
            if ((char)local_334 == '\0') {
              pdVar9 = (double *)((long)array_00 + (long)((int)pdVar18 * 2) * -8);
              local_2f8 = *pdVar9;
              local_300 = pdVar9[1];
              if (0 < (int)pdVar18) {
                uVar17 = (ulong)pdVar18 & 0xffffffff;
                pdVar9 = pdVar9 + 1;
                local_348 = array_00;
                do {
                  ffwldp(pdVar9[-1],*pdVar9,*(double *)(local_318 + 2),*(double *)(local_318 + 4),
                         *(double *)(local_318 + 6),*(double *)(local_318 + 8),
                         *(double *)(local_318 + 10),*(double *)(local_318 + 0xc),
                         *(double *)(local_318 + 0xe),(char *)local_2e8,&Xpos,&Ypos,status);
                  ffxypx(Xpos,Ypos,local_328->xrefval,local_328->yrefval,local_328->xrefpix,
                         local_328->yrefpix,local_328->xinc,local_328->yinc,local_328->rot,local_2f0
                         ,pdVar9 + -1,pdVar9,status);
                  if (*status != 0) goto LAB_001b8eb1;
                  pdVar9 = pdVar9 + 2;
                  uVar17 = uVar17 - 1;
                  array_00 = local_348;
                  pRVar6 = local_340;
                } while (uVar17 != 0);
              }
            }
            sVar1 = pRVar6[-1].shape;
            uVar11 = 0;
            if (sVar1 < poly_rgn) {
              if ((0x658U >> (sVar1 & 0x1f) & 1) == 0) {
                if ((0xa0U >> (sVar1 & 0x1f) & 1) == 0) {
                  uVar10 = 0;
                  if (sVar1 != circle_rgn) goto LAB_001b8b62;
                  uVar10 = 1;
                }
                else {
                  uVar10 = 4;
                }
              }
              else {
                uVar10 = 2;
              }
              uVar11 = 1;
            }
            else {
              uVar10 = 0;
            }
LAB_001b8b62:
            pWVar14 = local_328;
            if ((char)uVar11 != '\0') {
              local_348 = (anon_union_120_2_131c4ffb_for_param *)CONCAT44(local_348._4_4_,uVar11);
              iVar4 = ffgcvd(fptr,icol[3],(LONGLONG)local_330,1,(ulong)uVar10,0.0,(double *)array_00
                             ,&anynul,status);
              pWVar14 = local_328;
              if (iVar4 != 0) {
                pcVar16 = "Failed to read R column for region";
                goto LAB_001b8375;
              }
              if ((char)local_334 == '\0') {
                if ((char)local_348 != '\0') {
                  iVar4 = uVar10 + (uVar10 == 0);
                  do {
                    Y = (array_00->gen).p[0] + local_300;
                    X = local_2f8;
                    ffwldp(local_2f8,Y,*(double *)(local_318 + 2),*(double *)(local_318 + 4),
                           *(double *)(local_318 + 6),*(double *)(local_318 + 8),
                           *(double *)(local_318 + 10),*(double *)(local_318 + 0xc),
                           *(double *)(local_318 + 0xe),(char *)local_2e8,&Xpos,&Ypos,status);
                    ffxypx(Xpos,Ypos,pWVar14->xrefval,pWVar14->yrefval,pWVar14->xrefpix,
                           pWVar14->yrefpix,pWVar14->xinc,pWVar14->yinc,pWVar14->rot,local_2f0,&X,&Y
                           ,status);
                    if (*status != 0) goto LAB_001b8eb1;
                    dVar20 = X - (local_320->gen).p[0];
                    dVar21 = Y - *(double *)((long)local_320 + 8);
                    dVar20 = dVar21 * dVar21 + dVar20 * dVar20;
                    if (dVar20 < 0.0) {
                      dVar20 = sqrt(dVar20);
                    }
                    else {
                      dVar20 = SQRT(dVar20);
                    }
                    (array_00->gen).p[0] = dVar20;
                    array_00 = (anon_union_120_2_131c4ffb_for_param *)((long)array_00 + 8);
                    iVar4 = iVar4 + -1;
                  } while (iVar4 != 0);
                }
              }
              else {
                array_00 = (anon_union_120_2_131c4ffb_for_param *)
                           ((long)array_00 + (ulong)uVar10 * 8);
              }
            }
            sVar1 = local_340[-1].shape;
            uVar11 = 0;
            if (sVar1 < poly_rgn) {
              if ((0x250U >> (sVar1 & 0x1f) & 1) == 0) {
                uVar10 = 0;
                if ((0x4a0U >> (sVar1 & 0x1f) & 1) == 0) goto LAB_001b8d60;
                uVar10 = 2;
              }
              else {
                uVar10 = 1;
              }
              uVar11 = 1;
            }
            else {
              uVar10 = 0;
            }
LAB_001b8d60:
            if ((char)uVar11 != '\0') {
              local_348 = (anon_union_120_2_131c4ffb_for_param *)CONCAT44(local_348._4_4_,uVar11);
              iVar4 = ffgcvd(fptr,icol[4],(LONGLONG)local_330,1,(ulong)uVar10,0.0,(double *)array_00
                             ,&anynul,status);
              if (iVar4 != 0) {
                pcVar16 = "Failed to read ROTANG column for region";
                goto LAB_001b8375;
              }
              if (((char)local_334 == '\0') && ((char)local_348 != '\0')) {
                dVar20 = pWVar14->rot;
                dVar21 = *(double *)(local_318 + 0xe);
                lVar8 = 0;
                do {
                  *(double *)((long)array_00 + lVar8 * 8) =
                       *(double *)((long)array_00 + lVar8 * 8) + (dVar20 - dVar21);
                  lVar8 = lVar8 + 1;
                } while (uVar10 + ((ulong)uVar10 == 0) != (int)lVar8);
              }
            }
            pdVar9 = local_330;
            if (local_2a8 == 0) {
              iVar4 = ffgcv(fptr,0x1f,icol[5],(LONGLONG)local_330,1,1,(void *)0x0,
                            &local_340[-1].comp,&anynul,status);
              if (iVar4 != 0) {
                pcVar16 = "Failed to read COMPONENT column for region";
                goto LAB_001b8375;
              }
            }
            else {
              local_340[-1].comp = 1;
            }
            fits_setup_shape(local_288);
            pdVar18 = (double *)((long)pdVar9 + 1);
          } while ((long)pdVar9 < (long)pSVar5->nShapes);
        }
      }
      goto LAB_001b837a;
    }
    pcVar16 = "Could not read NAXIS2 keyword.";
  }
  else {
    pcVar16 = "Could not move to REGION extension.";
  }
LAB_001b8375:
  ffpmsg(pcVar16);
LAB_001b837a:
  if (*status == 0) {
    *local_278 = pSVar5;
  }
  else {
    fits_free_region(pSVar5);
  }
  ffclos(fptr,status);
  return *status;
LAB_001b8eb1:
  pcVar16 = "Failed to transform coordinates";
  goto LAB_001b8375;
}

Assistant:

int fits_read_fits_region ( fitsfile *fptr, 
			    WCSdata *wcs, 
			    SAORegion **Rgn, 
			    int *status)
/*  Read regions from a FITS region extension and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{

  int i, j, icol[6], idum, anynul, npos;
  int dotransform, got_component = 1, tstatus;
  long icsize[6];
  double X, Y, Theta, Xsave = 0, Ysave = 0, Xpos, Ypos;
  double *coords;
  char *cvalue, *cvalue2;
  char comment[FLEN_COMMENT];
  char colname[6][FLEN_VALUE] = {"X", "Y", "SHAPE", "R", "ROTANG", "COMPONENT"};
  char shapename[17][FLEN_VALUE] = {"POINT","CIRCLE","ELLIPSE","ANNULUS",
				    "ELLIPTANNULUS","BOX","ROTBOX","BOXANNULUS",
				    "RECTANGLE","ROTRECTANGLE","POLYGON","PIE",
				    "SECTOR","DIAMOND","RHOMBUS","ROTDIAMOND",
				    "ROTRHOMBUS"};
  int shapetype[17] = {point_rgn, circle_rgn, ellipse_rgn, annulus_rgn, 
		       elliptannulus_rgn, box_rgn, box_rgn, boxannulus_rgn, 
		       rectangle_rgn, rectangle_rgn, poly_rgn, sector_rgn, 
		       sector_rgn, diamond_rgn, diamond_rgn, diamond_rgn, 
		       diamond_rgn};
  SAORegion *aRgn;
  RgnShape *newShape;
  WCSdata *regwcs = 0;

  if ( *status ) return( *status );

  aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
  if( ! aRgn ) {
    ffpmsg("Couldn't allocate memory to hold Region file contents.");
    return(*status = MEMORY_ALLOCATION );
  }
  aRgn->nShapes    =    0;
  aRgn->Shapes     = NULL;
  if( wcs && wcs->exists )
    aRgn->wcs = *wcs;
  else
    aRgn->wcs.exists = 0;

  /* See if we are already positioned to a region extension, else */
  /* move to the REGION extension (file is already open). */

  tstatus = 0;
  for (i=0; i<5; i++) {
    ffgcno(fptr, CASEINSEN, colname[i], &icol[i], &tstatus);
  }

  if (tstatus) {
    /* couldn't find the required columns, so search for "REGION" extension */
    if ( ffmnhd(fptr, BINARY_TBL, "REGION", 1, status) ) {
      ffpmsg("Could not move to REGION extension.");
      goto error;
    }
  }

  /* get the number of shapes and allocate memory */

  if ( ffgky(fptr, TINT, "NAXIS2", &aRgn->nShapes, comment, status) ) {
    ffpmsg("Could not read NAXIS2 keyword.");
    goto error;
  }

  aRgn->Shapes = (RgnShape *) malloc(aRgn->nShapes * sizeof(RgnShape));
  if ( !aRgn->Shapes ) {
    ffpmsg( "Failed to allocate memory for Region data");
    *status = MEMORY_ALLOCATION;
    goto error;
  }

  /* get the required column numbers */

  for (i=0; i<5; i++) {
    if ( ffgcno(fptr, CASEINSEN, colname[i], &icol[i], status) ) {
      ffpmsg("Could not find column.");
      goto error;
    }
  }

  /* try to get the optional column numbers */

  if ( ffgcno(fptr, CASEINSEN, colname[5], &icol[5], status) ) {
       got_component = 0;
  }

  /* if there was input WCS then read the WCS info for the region in case they */
  /* are different and we have to transform */

  dotransform = 0;
  if ( aRgn->wcs.exists ) {
    regwcs = (WCSdata *) malloc ( sizeof(WCSdata) );
    if ( !regwcs ) {
      ffpmsg( "Failed to allocate memory for Region WCS data");
      *status = MEMORY_ALLOCATION;
      goto error;
    }

    regwcs->exists = 1;
    if ( ffgtcs(fptr, icol[0], icol[1], &regwcs->xrefval,  &regwcs->yrefval,
		&regwcs->xrefpix, &regwcs->yrefpix, &regwcs->xinc, &regwcs->yinc,
		&regwcs->rot, regwcs->type, status) ) {
      regwcs->exists = 0;
      *status = 0;
    }

    if ( regwcs->exists && wcs->exists ) {
      if ( fabs(regwcs->xrefval-wcs->xrefval) > 1.0e-6 ||
	   fabs(regwcs->yrefval-wcs->yrefval) > 1.0e-6 ||
	   fabs(regwcs->xrefpix-wcs->xrefpix) > 1.0e-6 ||
	   fabs(regwcs->yrefpix-wcs->yrefpix) > 1.0e-6 ||
	   fabs(regwcs->xinc-wcs->xinc) > 1.0e-6 ||
	   fabs(regwcs->yinc-wcs->yinc) > 1.0e-6 ||
	   fabs(regwcs->rot-wcs->rot) > 1.0e-6 ||
	   !strcmp(regwcs->type,wcs->type) ) dotransform = 1;
    }
  }

  /* get the sizes of the X, Y, R, and ROTANG vectors */

  for (i=0; i<6; i++) {
    if ( ffgtdm(fptr, icol[i], 1, &idum, &icsize[i], status) ) {
      ffpmsg("Could not find vector size of column.");
      goto error;
    }
  }

  cvalue = (char *) malloc ((FLEN_VALUE+1)*sizeof(char));

  /* loop over the shapes - note 1-based counting for rows in FITS files */

  for (i=1; i<=aRgn->nShapes; i++) {

    newShape = &aRgn->Shapes[i-1];
    for (j=0; j<8; j++) newShape->param.gen.p[j] = 0.0;
    newShape->param.gen.a = 0.0;
    newShape->param.gen.b = 0.0;
    newShape->param.gen.sinT = 0.0;
    newShape->param.gen.cosT = 0.0;

    /* get the shape */

    if ( ffgcvs(fptr, icol[2], i, 1, 1, " ", &cvalue, &anynul, status) ) {
      ffpmsg("Could not read shape.");
      goto error;
    }

    /* set include or exclude */

    newShape->sign = 1;
    cvalue2 = cvalue;
    if ( !strncmp(cvalue,"!",1) ) {
      newShape->sign = 0;
      cvalue2++;
    }

    /* set the shape type */

    for (j=0; j<17; j++) {
      if ( !strcmp(cvalue2, shapename[j]) ) newShape->shape = shapetype[j];
    }

    /* allocate memory for polygon case and set coords pointer */

    if ( newShape->shape == poly_rgn ) {
      newShape->param.poly.Pts = (double *) calloc (2*icsize[0], sizeof(double));
      if ( !newShape->param.poly.Pts ) {
	ffpmsg("Could not allocate memory to hold polygon parameters" );
	*status = MEMORY_ALLOCATION;
	goto error;
      }
      newShape->param.poly.nPts = 2*icsize[0];
      coords = newShape->param.poly.Pts;
    } else {
      coords = newShape->param.gen.p;
    }


  /* read X and Y. Polygon and Rectangle require special cases */

    npos = 1;
    if ( newShape->shape == poly_rgn ) npos = newShape->param.poly.nPts/2;
    if ( newShape->shape == rectangle_rgn ) npos = 2;

    for (j=0; j<npos; j++) {
      if ( ffgcvd(fptr, icol[0], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read X column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) {  /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
      coords++;
      
      if ( ffgcvd(fptr, icol[1], i, j+1, 1, DOUBLENULLVALUE, coords, &anynul, status) ) {
	ffpmsg("Failed to read Y column for polygon region");
	goto error;
      }
      if (*coords == DOUBLENULLVALUE) { /* check for null value end of array marker */
        npos = j;
	newShape->param.poly.nPts = npos * 2;
        coords--;
	break;
      }
      coords++;
 
      if (j == 0) {  /* save the first X and Y coordinate */
        Xsave = *(coords - 2);
	Ysave = *(coords - 1);
      } else if ((Xsave == *(coords - 2)) && (Ysave == *(coords - 1)) ) {
        /* if point has same coordinate as first point, this marks the end of the array */
        npos = j + 1;
	newShape->param.poly.nPts = npos * 2;
	break;
      }
    }

    /* transform positions if the region and input wcs differ */

    if ( dotransform ) {

      coords -= npos*2;
      Xsave = coords[0];
      Ysave = coords[1];
      for (j=0; j<npos; j++) {
	ffwldp(coords[2*j], coords[2*j+1], regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
	       regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
	       regwcs->type, &Xpos, &Ypos, status);
	ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
	       wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
	       wcs->type, &coords[2*j], &coords[2*j+1], status);
	if ( *status ) {
	  ffpmsg("Failed to transform coordinates");
	  goto error;
	}
      }
      coords += npos*2;
    }

  /* read R. Circle requires one number; Box, Diamond, Ellipse, Annulus, Sector 
     and Panda two; Boxannulus and Elliptannulus four; Point, Rectangle and 
     Polygon none. */

    npos = 0;
    switch ( newShape->shape ) {
    case circle_rgn: 
      npos = 1;
      break;
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
    case annulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
      npos = 4;
      break;
    default:
      break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[3], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read R column for region");
	goto error;
      }

    /* transform lengths if the region and input wcs differ */

      if ( dotransform ) {
	for (j=0; j<npos; j++) {
	  Y = Ysave + (*coords);
	  X = Xsave;
	  ffwldp(X, Y, regwcs->xrefval, regwcs->yrefval, regwcs->xrefpix,
		 regwcs->yrefpix, regwcs->xinc, regwcs->yinc, regwcs->rot,
		 regwcs->type, &Xpos, &Ypos, status);
	  ffxypx(Xpos, Ypos, wcs->xrefval, wcs->yrefval, wcs->xrefpix,
		 wcs->yrefpix, wcs->xinc, wcs->yinc, wcs->rot,
		 wcs->type, &X, &Y, status);
	  if ( *status ) {
	    ffpmsg("Failed to transform coordinates");
	    goto error;
	  }
	  *(coords++) = sqrt(pow(X-newShape->param.gen.p[0],2)+pow(Y-newShape->param.gen.p[1],2));
	}
      } else {
	coords += npos;
      }
    }

  /* read ROTANG. Requires two values for Boxannulus, Elliptannulus, Sector, 
     Panda; one for Box, Diamond, Ellipse; and none for Circle, Point, Annulus, 
     Rectangle, Polygon */

    npos = 0;
    switch ( newShape->shape ) {
    case box_rgn:
    case diamond_rgn:
    case ellipse_rgn:
      npos = 1;
      break;
    case boxannulus_rgn:
    case elliptannulus_rgn:
    case sector_rgn:
      npos = 2;
      break;
    default:
     break;
    }

    if ( npos > 0 ) {
      if ( ffgcvd(fptr, icol[4], i, 1, npos, 0.0, coords, &anynul, status) ) {
	ffpmsg("Failed to read ROTANG column for region");
	goto error;
      }

    /* transform angles if the region and input wcs differ */

      if ( dotransform ) {
	Theta = (wcs->rot) - (regwcs->rot);
	for (j=0; j<npos; j++) *(coords++) += Theta;
      } else {
	coords += npos;
      }
    }

  /* read the component number */

    if (got_component) {
      if ( ffgcv(fptr, TINT, icol[5], i, 1, 1, 0, &newShape->comp, &anynul, status) ) {
        ffpmsg("Failed to read COMPONENT column for region");
        goto error;
      }
    } else {
      newShape->comp = 1;
    }


    /* do some precalculations to speed up tests */

    fits_setup_shape(newShape);

    /* end loop over shapes */

  }

error:

   if( *status )
      fits_free_region( aRgn );
   else
      *Rgn = aRgn;

   ffclos(fptr, status);

   return( *status );
}